

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleElement.cpp
# Opt level: O2

void __thiscall DoubleElement::DoubleElement(DoubleElement *this)

{
  allocator<char> local_31;
  string local_30;
  
  StreamObject::StreamObject(&this->super_StreamObject);
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ac40;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"DoubleElement",&local_31);
  StreamObject::setName(&this->super_StreamObject,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

DoubleElement::DoubleElement( )
{
	setName( "DoubleElement" );
}